

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

void xmlTextReaderFreeNode(xmlTextReaderPtr reader,xmlNodePtr cur)

{
  xmlElementType xVar1;
  xmlNodePtr cur_00;
  _xmlAttr *p_Var2;
  xmlChar *str;
  xmlParserCtxtPtr pxVar3;
  xmlAttrPtr cur_01;
  int iVar4;
  xmlDeregisterNodeFunc *pp_Var5;
  xmlDictPtr dict;
  
  if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = reader->ctxt->dict;
  }
  xVar1 = cur->type;
  if (xVar1 == XML_ATTRIBUTE_NODE) {
    xmlTextReaderFreeProp(reader,(xmlAttrPtr)cur);
    return;
  }
  if (xVar1 == XML_NAMESPACE_DECL) {
    xmlFreeNs((xmlNsPtr)cur);
    return;
  }
  if (xVar1 != XML_DTD_NODE) {
    cur_00 = cur->children;
    if (xVar1 != XML_ENTITY_REF_NODE && cur_00 != (xmlNodePtr)0x0) {
      if (cur_00->parent == cur) {
        xmlTextReaderFreeNodeList(reader,cur_00);
      }
      cur->children = (_xmlNode *)0x0;
    }
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var5 = __xmlDeregisterNodeDefaultValue(), *pp_Var5 != (xmlDeregisterNodeFunc)0x0)) {
      pp_Var5 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var5)(cur);
    }
    if ((cur->type < XML_DOCB_DOCUMENT_NODE) &&
       ((0x180002U >> (cur->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
      cur_01 = cur->properties;
      while (cur_01 != (xmlAttrPtr)0x0) {
        p_Var2 = cur_01->next;
        xmlTextReaderFreeProp(reader,cur_01);
        cur_01 = p_Var2;
      }
    }
    str = cur->content;
    if (((_xmlAttr **)str != &cur->properties) &&
       ((((XML_XINCLUDE_END < cur->type ||
          ((0x180022U >> (cur->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) &&
         (str != (xmlChar *)0x0)) &&
        ((dict == (xmlDictPtr)0x0 || (iVar4 = xmlDictOwns(dict,str), iVar4 == 0)))))) {
      (*xmlFree)(cur->content);
    }
    if (((cur->type < XML_DOCB_DOCUMENT_NODE) &&
        ((0x180002U >> (cur->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) &&
       (cur->nsDef != (xmlNsPtr)0x0)) {
      xmlFreeNsList(cur->nsDef);
    }
    if ((((cur->type != XML_TEXT_NODE) && (cur->type != XML_COMMENT_NODE)) &&
        (cur->name != (xmlChar *)0x0)) &&
       ((dict == (xmlDictPtr)0x0 || (iVar4 = xmlDictOwns(dict,cur->name), iVar4 == 0)))) {
      (*xmlFree)(cur->name);
    }
    if ((((cur->type | XML_ATTRIBUTE_NODE) == XML_TEXT_NODE) &&
        (pxVar3 = reader->ctxt, pxVar3 != (xmlParserCtxtPtr)0x0)) &&
       (iVar4 = pxVar3->freeElemsNr, iVar4 < 100)) {
      cur->next = pxVar3->freeElems;
      pxVar3->freeElems = cur;
      pxVar3->freeElemsNr = iVar4 + 1;
      return;
    }
    (*xmlFree)(cur);
    return;
  }
  xmlFreeDtd((xmlDtdPtr)cur);
  return;
}

Assistant:

static void
xmlTextReaderFreeNode(xmlTextReaderPtr reader, xmlNodePtr cur) {
    xmlDictPtr dict;

    if ((reader != NULL) && (reader->ctxt != NULL))
	dict = reader->ctxt->dict;
    else
        dict = NULL;
    if (cur->type == XML_DTD_NODE) {
	xmlFreeDtd((xmlDtdPtr) cur);
	return;
    }
    if (cur->type == XML_NAMESPACE_DECL) {
	xmlFreeNs((xmlNsPtr) cur);
        return;
    }
    if (cur->type == XML_ATTRIBUTE_NODE) {
	xmlTextReaderFreeProp(reader, (xmlAttrPtr) cur);
	return;
    }

    if ((cur->children != NULL) &&
	(cur->type != XML_ENTITY_REF_NODE)) {
	if (cur->children->parent == cur)
	    xmlTextReaderFreeNodeList(reader, cur->children);
	cur->children = NULL;
    }

    if ((__xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue(cur);

    if (((cur->type == XML_ELEMENT_NODE) ||
	 (cur->type == XML_XINCLUDE_START) ||
	 (cur->type == XML_XINCLUDE_END)) &&
	(cur->properties != NULL))
	xmlTextReaderFreePropList(reader, cur->properties);
    if ((cur->content != (xmlChar *) &(cur->properties)) &&
        (cur->type != XML_ELEMENT_NODE) &&
	(cur->type != XML_XINCLUDE_START) &&
	(cur->type != XML_XINCLUDE_END) &&
	(cur->type != XML_ENTITY_REF_NODE)) {
	DICT_FREE(cur->content);
    }
    if (((cur->type == XML_ELEMENT_NODE) ||
	 (cur->type == XML_XINCLUDE_START) ||
	 (cur->type == XML_XINCLUDE_END)) &&
	(cur->nsDef != NULL))
	xmlFreeNsList(cur->nsDef);

    /*
     * we don't free names here they are interned now
     */
    if ((cur->type != XML_TEXT_NODE) &&
        (cur->type != XML_COMMENT_NODE))
	DICT_FREE(cur->name);

    if (((cur->type == XML_ELEMENT_NODE) ||
	 (cur->type == XML_TEXT_NODE)) &&
	(reader != NULL) && (reader->ctxt != NULL) &&
	(reader->ctxt->freeElemsNr < MAX_FREE_NODES)) {
	cur->next = reader->ctxt->freeElems;
	reader->ctxt->freeElems = cur;
	reader->ctxt->freeElemsNr++;
    } else {
	xmlFree(cur);
    }
}